

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferDetail.h
# Opt level: O0

bool ViconCGStreamIO::VBufferDetail<0>::Read(VBufferImpl *i_rBufferImpl,string *o_rValue)

{
  string *psVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  uint local_24;
  uint Offset;
  UInt32 Size;
  string *o_rValue_local;
  VBufferImpl *i_rBufferImpl_local;
  
  local_24 = 0;
  _Offset = o_rValue;
  o_rValue_local = (string *)i_rBufferImpl;
  bVar2 = VBufferImpl::ReadPod<unsigned_int>(i_rBufferImpl,&local_24);
  if (bVar2) {
    uVar3 = VBufferImpl::Offset((VBufferImpl *)o_rValue_local);
    uVar4 = uVar3 + local_24;
    uVar5 = VBufferImpl::Length((VBufferImpl *)o_rValue_local);
    psVar1 = _Offset;
    if (uVar5 < uVar4) {
      i_rBufferImpl_local._7_1_ = false;
    }
    else {
      puVar6 = VBufferImpl::Raw((VBufferImpl *)o_rValue_local);
      std::__cxx11::string::assign((char *)psVar1,(ulong)(puVar6 + uVar3));
      VBufferImpl::SetOffset((VBufferImpl *)o_rValue_local,uVar3 + local_24);
      i_rBufferImpl_local._7_1_ = true;
    }
  }
  else {
    i_rBufferImpl_local._7_1_ = false;
  }
  return i_rBufferImpl_local._7_1_;
}

Assistant:

static bool Read( const VBufferImpl & i_rBufferImpl, std::string & o_rValue )
  {
    ViconCGStreamType::UInt32 Size = 0;
    if( !i_rBufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    const unsigned int Offset = i_rBufferImpl.Offset();
    if( Offset + Size > i_rBufferImpl.Length() )
    {
      return false;
    }
    o_rValue.assign( reinterpret_cast< const char * >( i_rBufferImpl.Raw() + Offset ), Size );
    i_rBufferImpl.SetOffset( Offset + Size );
    return true;
  }